

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O1

void __thiscall clask::server_t::run(server_t *this,string *addr)

{
  int iVar1;
  long *__nptr;
  long lVar2;
  int *piVar3;
  runtime_error *this_00;
  undefined8 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> host;
  long *local_78 [2];
  long local_68 [2];
  string local_58;
  long *local_38;
  
  lVar2 = std::__cxx11::string::rfind((char)addr,0x3a);
  if (lVar2 == -1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"invalid host:port");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::substr((ulong)&local_58,(ulong)addr);
  std::__cxx11::string::substr((ulong)local_78,(ulong)addr);
  __nptr = local_78[0];
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  *piVar3 = 0;
  lVar2 = strtol((char *)__nptr,(char **)&local_38,10);
  if (local_38 == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar2 == lVar2) && (*piVar3 != 0x22)) {
    if (*piVar3 == 0) {
      *piVar3 = iVar1;
    }
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
    _run(this,&local_58,(int)lVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  uVar4 = std::__throw_out_of_range("stoi");
  __cxa_free_exception(piVar3);
  _Unwind_Resume(uVar4);
}

Assistant:

inline void server_t::run(const std::string& addr) {
  auto pos = addr.find_last_of(':');
  if (pos == std::string::npos) {
    throw std::runtime_error("invalid host:port");
  }
  auto host = addr.substr(0, pos);
  auto port = std::stoi(addr.substr(pos + 1));
  _run(host, port);
}